

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycling_allocator.hpp
# Opt level: O2

executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
* __thiscall
asio::detail::
recycling_allocator<asio::detail::executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>,_asio::detail::thread_info_base::default_tag>
::allocate(recycling_allocator<asio::detail::executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>,_asio::detail::thread_info_base::default_tag>
           *this,size_t n)

{
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  *peVar1;
  undefined8 uVar2;
  long *in_FS_OFFSET;
  
  if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
  }
  peVar1 = (executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
            *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                        (uVar2,n * 0x28,8);
  return peVar1;
}

Assistant:

T* allocate(std::size_t n)
  {
#if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = thread_info_base::allocate(Purpose(),
        thread_context::top_of_thread_call_stack(),
        sizeof(T) * n, alignof(T));
#else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = asio::aligned_new(align, s);
#endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    return static_cast<T*>(p);
  }